

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

bool __thiscall
duckdb::RowGroupCollection::ScheduleVacuumTasks
          (RowGroupCollection *this,CollectionCheckpointState *checkpoint_state,VacuumState *state,
          idx_t segment_idx,bool schedule_vacuum)

{
  vector<unsigned_long,_true> *this_00;
  idx_t *piVar1;
  VacuumState *pVVar2;
  reference pvVar3;
  ulong uVar4;
  pointer this_01;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t __n;
  bool bVar8;
  _Head_base<0UL,_duckdb::Task_*,_false> local_80;
  Task *local_78;
  idx_t merge_rows;
  idx_t merge_count;
  VacuumState *local_60;
  idx_t local_58;
  idx_t local_50;
  ulong local_48;
  ulong local_40;
  idx_t segment_idx_local;
  
  if (state->can_vacuum_deletes == true) {
    if (segment_idx < state->next_vacuum_idx) {
      return true;
    }
    this_00 = &state->row_group_counts;
    local_60 = state;
    local_50 = segment_idx;
    segment_idx_local = segment_idx;
    pvVar3 = vector<unsigned_long,_true>::get<true>(this_00,segment_idx);
    if (schedule_vacuum && *pvVar3 != 0) {
      local_58 = this->row_group_size;
      uVar4 = 1;
      while (uVar4 != 4) {
        merge_count = 0;
        merge_rows = 0;
        uVar6 = uVar4 * local_58;
        uVar7 = 0;
        iVar5 = 0;
        local_48 = uVar4;
        local_40 = uVar4;
        for (__n = local_50;
            __n < (ulong)((long)(checkpoint_state->segments->
                                super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                ).
                                super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(checkpoint_state->segments->
                                super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                ).
                                super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 1) {
          pvVar3 = vector<unsigned_long,_true>::get<true>(this_00,__n);
          if (*pvVar3 != 0) {
            pvVar3 = vector<unsigned_long,_true>::get<true>(this_00,__n);
            if (uVar6 < *pvVar3 + iVar5) break;
            pvVar3 = vector<unsigned_long,_true>::get<true>(this_00,__n);
            iVar5 = iVar5 + *pvVar3;
            uVar7 = uVar7 + 1;
            merge_rows = iVar5;
            merge_count = uVar7;
          }
        }
        pVVar2 = local_60;
        uVar4 = local_48 + 1;
        if (local_48 < uVar7) {
          bVar8 = local_48 < 4;
          if (!bVar8) {
            return bVar8;
          }
          make_uniq<duckdb::VacuumTask,duckdb::CollectionCheckpointState&,duckdb::VacuumState&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&>
                    ((duckdb *)&local_78,checkpoint_state,local_60,&segment_idx_local,&merge_count,
                     &local_40,&merge_rows,&local_60->row_start);
          this_01 = unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>,_true>
                    ::operator->(&checkpoint_state->executor);
          local_80._M_head_impl = local_78;
          local_78 = (Task *)0x0;
          TaskExecutor::ScheduleTask
                    (this_01,(unique_ptr<duckdb::Task,_std::default_delete<duckdb::Task>,_true> *)
                             &local_80);
          if (local_80._M_head_impl != (Task *)0x0) {
            (*(local_80._M_head_impl)->_vptr_Task[1])();
          }
          local_80._M_head_impl = (Task *)0x0;
          pVVar2->next_vacuum_idx = __n;
          piVar1 = &pVVar2->row_start;
          *piVar1 = *piVar1 + merge_rows;
          if (local_78 == (Task *)0x0) {
            return bVar8;
          }
          (**(code **)(*(long *)local_78 + 8))();
          return bVar8;
        }
      }
    }
  }
  return false;
}

Assistant:

bool RowGroupCollection::ScheduleVacuumTasks(CollectionCheckpointState &checkpoint_state, VacuumState &state,
                                             idx_t segment_idx, bool schedule_vacuum) {
	static constexpr const idx_t MAX_MERGE_COUNT = 3;

	if (!state.can_vacuum_deletes) {
		// we cannot vacuum deletes - cannot vacuum
		return false;
	}
	if (segment_idx < state.next_vacuum_idx) {
		// this segment is being vacuumed by a previously scheduled task
		return true;
	}
	if (state.row_group_counts[segment_idx] == 0) {
		// segment was already dropped - skip
		D_ASSERT(!checkpoint_state.segments[segment_idx].node);
		return false;
	}
	if (!schedule_vacuum) {
		return false;
	}
	idx_t merge_rows;
	idx_t next_idx = 0;
	idx_t merge_count;
	idx_t target_count;
	bool perform_merge = false;
	// check if we can merge row groups adjacent to the current segment_idx
	// we try merging row groups into batches of 1-3 row groups
	// our goal is to reduce the amount of row groups
	// hence we target_count should be less than merge_count for a marge to be worth it
	// we greedily prefer to merge to the lowest target_count
	// i.e. we prefer to merge 2 row groups into 1, than 3 row groups into 2
	const idx_t row_group_size = GetRowGroupSize();
	for (target_count = 1; target_count <= MAX_MERGE_COUNT; target_count++) {
		auto total_target_size = target_count * row_group_size;
		merge_count = 0;
		merge_rows = 0;
		for (next_idx = segment_idx; next_idx < checkpoint_state.segments.size(); next_idx++) {
			if (state.row_group_counts[next_idx] == 0) {
				continue;
			}
			if (merge_rows + state.row_group_counts[next_idx] > total_target_size) {
				// does not fit
				break;
			}
			// we can merge this row group together with the other row group
			merge_rows += state.row_group_counts[next_idx];
			merge_count++;
		}
		if (target_count < merge_count) {
			// we can reduce "merge_count" row groups to "target_count"
			// perform the merge at this level
			perform_merge = true;
			break;
		}
	}
	if (!perform_merge) {
		return false;
	}
	// schedule the vacuum task
	auto vacuum_task = make_uniq<VacuumTask>(checkpoint_state, state, segment_idx, merge_count, target_count,
	                                         merge_rows, state.row_start);
	checkpoint_state.executor->ScheduleTask(std::move(vacuum_task));
	// skip vacuuming by the row groups we have merged
	state.next_vacuum_idx = next_idx;
	state.row_start += merge_rows;
	return true;
}